

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::~QPDF(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Base_ptr p_Var2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  ::clear(&(((this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table)._M_t);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  for (p_Var2 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->obj_cache + 0x18);
      p_Var2 != (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->obj_cache + 8U);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p_Var2[1]._M_parent);
    Disconnect::disconnect((Disconnect *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::~unique_ptr(&this->m);
  return;
}

Assistant:

QPDF::~QPDF()
{
    // If two objects are mutually referential (through each object having an array or dictionary
    // that contains an indirect reference to the other), the circular references in the
    // std::shared_ptr objects will prevent the objects from being deleted. Walk through all objects
    // in the object cache, which is those objects that we read from the file, and break all
    // resolved indirect references by replacing them with an internal object type representing that
    // they have been destroyed. Note that we can't break references like this at any time when the
    // QPDF object is active. The call to reset also causes all direct QPDFObjectHandle objects that
    // are reachable from this object to release their association with this QPDF. Direct objects
    // are not destroyed since they can be moved to other QPDF objects safely.

    // At this point, obviously no one is still using the QPDF object, but we'll explicitly clear
    // the xref table anyway just to prevent any possibility of resolve() succeeding.
    m->xref_table.clear();
    for (auto const& iter: m->obj_cache) {
        Disconnect(iter.second.object).disconnect();
    }
}